

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_estimateDStreamSize_fromFrame(void *src,size_t srcSize)

{
  uint uVar1;
  size_t err;
  ZSTD_frameHeader zfh;
  U32 windowSizeMax;
  void *in_stack_ffffffffffffffa8;
  ZSTD_frameHeader *in_stack_ffffffffffffffb0;
  ulong in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  local_8 = ZSTD_getFrameHeader(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x201faa);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    if (local_8 == 0) {
      if (in_stack_ffffffffffffffc0 < 0x80000001) {
        local_8 = ZSTD_estimateDStreamSize(in_stack_ffffffffffffffc0);
      }
      else {
        local_8 = 0xfffffffffffffff0;
      }
    }
    else {
      local_8 = 0xffffffffffffffb8;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateDStreamSize_fromFrame(const void* src, size_t srcSize)
{
    U32 const windowSizeMax = 1U << ZSTD_WINDOWLOG_MAX;   /* note : should be user-selectable */
    ZSTD_frameHeader zfh;
    size_t const err = ZSTD_getFrameHeader(&zfh, src, srcSize);
    if (ZSTD_isError(err)) return err;
    if (err>0) return ERROR(srcSize_wrong);
    if (zfh.windowSize > windowSizeMax)
        return ERROR(frameParameter_windowTooLarge);
    return ZSTD_estimateDStreamSize((size_t)zfh.windowSize);
}